

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O2

mpc_ast_t * mpc_ast_add_tag(mpc_ast_t *a,char *t)

{
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  
  if (a != (mpc_ast_t *)0x0) {
    pcVar3 = a->tag;
    sVar1 = strlen(t);
    sVar2 = strlen(pcVar3);
    pcVar3 = (char *)realloc(pcVar3,sVar1 + sVar2 + 2);
    a->tag = pcVar3;
    sVar1 = strlen(t);
    sVar2 = strlen(pcVar3);
    memmove(pcVar3 + sVar1 + 1,pcVar3,sVar2 + 1);
    memcpy(pcVar3,t,sVar1);
    pcVar3[sVar1] = '|';
  }
  return a;
}

Assistant:

mpc_ast_t *mpc_ast_add_tag(mpc_ast_t *a, const char *t) {
  if (a == NULL) { return a; }
  a->tag = realloc(a->tag, strlen(t) + 1 + strlen(a->tag) + 1);
  memmove(a->tag + strlen(t) + 1, a->tag, strlen(a->tag)+1);
  memmove(a->tag, t, strlen(t));
  memmove(a->tag + strlen(t), "|", 1);
  return a;
}